

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O2

void __thiscall
icu_63::CalendarAstronomer::CalendarAstronomer
          (CalendarAstronomer *this,double longitude,double latitude)

{
  UDate UVar1;
  double dVar2;
  
  UVar1 = Calendar::getNow();
  this->fTime = UVar1;
  (this->moonPosition).ascension = 0.0;
  (this->moonPosition).declination = 0.0;
  this->moonPositionSet = '\0';
  dVar2 = normPI(longitude * 0.017453292519943295);
  this->fLongitude = dVar2;
  dVar2 = normPI(latitude * 0.017453292519943295);
  this->fLatitude = dVar2;
  this->fGmtOffset = (this->fLongitude * 24.0 * 3600000.0) / 6.283185307179586;
  clearCache(this);
  return;
}

Assistant:

CalendarAstronomer::CalendarAstronomer(double longitude, double latitude) :
  fTime(Calendar::getNow()), moonPosition(0,0), moonPositionSet(FALSE) {
  fLongitude = normPI(longitude * (double)DEG_RAD);
  fLatitude  = normPI(latitude  * (double)DEG_RAD);
  fGmtOffset = (double)(fLongitude * 24. * (double)HOUR_MS / (double)CalendarAstronomer_PI2);
  clearCache();
}